

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BgzfStream::Seek(BgzfStream *this,int64_t *position)

{
  bool bVar1;
  ulong uVar2;
  ostream *this_00;
  undefined8 uVar3;
  long *in_RSI;
  undefined4 *in_RDI;
  stringstream s;
  int64_t blockAddress;
  int blockOffset;
  BgzfStream *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  BamException *in_stack_fffffffffffffe20;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  ulong local_20;
  uint local_14;
  long *local_10;
  
  local_10 = in_RSI;
  bamtools_noop();
  bVar1 = IsOpen(in_stack_fffffffffffffdd8);
  if (bVar1) {
    local_14 = (uint)*local_10 & 0xffff;
    local_20 = *local_10 >> 0x10 & 0xffffffffffff;
    uVar2 = (**(code **)(**(long **)(in_RDI + 6) + 0x18))();
    if (((uVar2 & 1) == 0) ||
       (uVar2 = (**(code **)(**(long **)(in_RDI + 6) + 0x30))(*(long **)(in_RDI + 6),&local_20,0),
       (uVar2 & 1) == 0)) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      this_00 = std::operator<<(local_198,"unable to seek to position: ");
      std::ostream::operator<<(this_00,*local_10);
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,"BgzfStream::Seek",(allocator *)&stack0xfffffffffffffe27);
      std::__cxx11::stringstream::str();
      BamException::BamException
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
    }
    *in_RDI = 0;
    *(ulong *)(in_RDI + 2) = local_20;
    in_RDI[1] = local_14;
  }
  return;
}

Assistant:

void BgzfStream::Seek(const int64_t& position)
{

    BT_ASSERT_X(m_device, "BgzfStream::Seek() - trying to seek on null IO device");

    // skip if device is not open
    if (!IsOpen()) {
        return;
    }

    // determine adjusted offset & address
    int blockOffset = (position & 0xFFFF);
    int64_t blockAddress = (position >> 16) & 0xFFFFFFFFFFFFLL;

    // attempt seek in file
    if (m_device->IsRandomAccess() && m_device->Seek(blockAddress)) {

        // update block data & return success
        m_blockLength = 0;
        m_blockAddress = blockAddress;
        m_blockOffset = blockOffset;
    } else {
        std::stringstream s;
        s << "unable to seek to position: " << position;
        throw BamException("BgzfStream::Seek", s.str());
    }
}